

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderMatrixTests.cpp
# Opt level: O0

void deqp::gles3::Functional::MatrixCaseUtils::Evaluator<11,_9,_94>::evaluate
               (ShaderEvalContext *evalCtx,InputType in0Type,InputType in1Type)

{
  int in_ECX;
  Matrix<float,_3,_3> *extraout_RDX;
  Matrix<float,_3,_3> *extraout_RDX_00;
  Matrix<float,_3,_3> *mat;
  Matrix<float,_3,_3> *mat_00;
  VecAccess<float,_4,_3> local_d0;
  Matrix<float,_3,_3> local_b4;
  Vector<float,_3> local_90 [2];
  Matrix<float,_3,_3> local_78;
  Vector<float,_3> local_54;
  Vector<float,_3> local_48;
  undefined1 local_3c [8];
  Type in0;
  InputType in1Type_local;
  InputType in0Type_local;
  ShaderEvalContext *evalCtx_local;
  
  in0.m_data.m_data[2].m_data[1] = (float)in1Type;
  in0.m_data.m_data[2].m_data[2] = (float)in0Type;
  if (in0Type == INPUTTYPE_DYNAMIC) {
    getInputValue<2,9>((Mat3 *)local_3c,(MatrixCaseUtils *)evalCtx,(ShaderEvalContext *)0x0,in_ECX);
    mat = extraout_RDX;
  }
  else {
    getInputValue<0,9>((Mat3 *)local_3c,(MatrixCaseUtils *)evalCtx,(ShaderEvalContext *)0x0,in_ECX);
    mat = extraout_RDX_00;
  }
  increment<float,3,3>(&local_78,(MatrixCaseUtils *)local_3c,mat);
  MatrixCaseUtils::reduceToVec3((MatrixCaseUtils *)&local_54,&local_78);
  increment<float,3,3>(&local_b4,(MatrixCaseUtils *)local_3c,mat_00);
  MatrixCaseUtils::reduceToVec3((MatrixCaseUtils *)local_90,&local_b4);
  tcu::operator+((tcu *)&local_48,&local_54,local_90);
  tcu::Vector<float,_4>::xyz(&local_d0,&evalCtx->color);
  tcu::VecAccess<float,_4,_3>::operator=(&local_d0,&local_48);
  tcu::Matrix<float,_3,_3>::~Matrix(&local_b4);
  tcu::Matrix<float,_3,_3>::~Matrix(&local_78);
  tcu::Matrix<float,_3,_3>::~Matrix((Matrix<float,_3,_3> *)local_3c);
  return;
}

Assistant:

static void evaluate (ShaderEvalContext& evalCtx, InputType in0Type, InputType in1Type)
	{
		DE_UNREF(in1Type);
		typename TypeTraits<In0DataType>::Type	in0	= (in0Type == INPUTTYPE_DYNAMIC) ? getInputValue<INPUTTYPE_DYNAMIC, In0DataType>(evalCtx, 0)
																				     : getInputValue<INPUTTYPE_CONST,	In0DataType>(evalCtx, 0);

		// modifying reduction: sum modified value too
		evalCtx.color.xyz() = reduceToVec3(increment(in0)) + reduceToVec3(increment(in0));
	}